

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexMathFpu.cpp
# Opt level: O0

void Iex_3_4::handleExceptionsSetInRegisters(void)

{
  uint uVar1;
  uint uVar2;
  int exc;
  int mask;
  
  if ((anonymous_namespace)::fpeHandler != (code *)0x0) {
    uVar1 = FpuControl::getExceptionMask();
    uVar2 = FpuControl::getExceptions();
    if (((uVar1 & 4) == 0) && ((uVar2 & 4) != 0)) {
      (*(anonymous_namespace)::fpeHandler)(4,"Floating-point division by zero.");
    }
    else if (((uVar1 & 8) == 0) && ((uVar2 & 8) != 0)) {
      (*(anonymous_namespace)::fpeHandler)(1,"Floating-point overflow.");
    }
    else if (((uVar1 & 0x10) == 0) && ((uVar2 & 0x10) != 0)) {
      (*(anonymous_namespace)::fpeHandler)(2,"Floating-point underflow.");
    }
    else if (((uVar1 & 0x20) == 0) && ((uVar2 & 0x20) != 0)) {
      (*(anonymous_namespace)::fpeHandler)(8,"Inexact floating-point result.");
    }
    else if (((uVar1 & 1) == 0) && ((uVar2 & 1) != 0)) {
      (*(anonymous_namespace)::fpeHandler)(0x10,"Invalid floating-point operation.");
    }
  }
  return;
}

Assistant:

void
handleExceptionsSetInRegisters ()
{
    if (fpeHandler == 0) return;

    int mask = FpuControl::getExceptionMask ();

    int exc = FpuControl::getExceptions ();

    if (!(mask & FpuControl::DIVZERO_EXC) && (exc & FpuControl::DIVZERO_EXC))
    {
        fpeHandler (IEEE_DIVZERO, "Floating-point division by zero.");
        return;
    }

    if (!(mask & FpuControl::OVERFLOW_EXC) && (exc & FpuControl::OVERFLOW_EXC))
    {
        fpeHandler (IEEE_OVERFLOW, "Floating-point overflow.");
        return;
    }

    if (!(mask & FpuControl::UNDERFLOW_EXC) &&
        (exc & FpuControl::UNDERFLOW_EXC))
    {
        fpeHandler (IEEE_UNDERFLOW, "Floating-point underflow.");
        return;
    }

    if (!(mask & FpuControl::INEXACT_EXC) && (exc & FpuControl::INEXACT_EXC))
    {
        fpeHandler (IEEE_INEXACT, "Inexact floating-point result.");
        return;
    }

    if (!(mask & FpuControl::INVALID_EXC) && (exc & FpuControl::INVALID_EXC))
    {
        fpeHandler (IEEE_INVALID, "Invalid floating-point operation.");
        return;
    }
}